

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::alloc_temp_regs(size_t prec,size_t cnt,...)

{
  uint uVar1;
  CVmBigNumCacheReg *pCVar2;
  bool bVar3;
  uint uVar4;
  CVmBigNumCache *pCVar5;
  char in_AL;
  char *pcVar6;
  void **ppvVar7;
  undefined8 in_RCX;
  ulong uVar8;
  long *plVar9;
  undefined8 in_RDX;
  undefined8 *puVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar11;
  uint16_t tmp;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list marker;
  void **local_100;
  void *local_e8 [5];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &marker[0].overflow_arg_area;
  uVar4 = 0x10;
  if (cnt == 0) {
    return;
  }
  bVar3 = true;
  sVar11 = 0;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_e8[4] = (void *)in_R8;
  local_c0 = in_R9;
LAB_00235b49:
  do {
    sVar11 = sVar11 + 1;
    uVar8 = (ulong)uVar4;
    if (uVar8 < 0x29) {
      puVar10 = *(undefined8 **)((long)local_e8 + uVar8);
      uVar1 = uVar4 + 8;
      if (0x20 < uVar4) goto LAB_00235b88;
      ppvVar7 = (void **)((long)local_e8 + uVar8 + 8);
      uVar4 = uVar4 + 0x10;
    }
    else {
      puVar10 = (undefined8 *)*local_100;
      local_100 = local_100 + 1;
      uVar1 = uVar4;
LAB_00235b88:
      ppvVar7 = local_100;
      local_100 = local_100 + 1;
      uVar4 = uVar1;
    }
    pcVar6 = CVmBigNumCache::alloc_reg(S_bignum_cache,(prec + 1 >> 1) + 5,(uint *)*ppvVar7);
    if (pcVar6 == (char *)0x0) {
      *puVar10 = 0;
      bVar3 = false;
      if (sVar11 == cnt) goto LAB_00235bfe;
      goto LAB_00235b49;
    }
    *(short *)pcVar6 = (short)prec;
    pcVar6[4] = '\0';
    *puVar10 = pcVar6;
  } while (sVar11 != cnt);
  if (bVar3) {
    return;
  }
LAB_00235bfe:
  local_100 = &marker[0].overflow_arg_area;
  uVar4 = 0x10;
  do {
    pCVar5 = S_bignum_cache;
    uVar8 = (ulong)uVar4;
    if (uVar8 < 0x29) {
      plVar9 = *(long **)((long)local_e8 + uVar8);
      uVar1 = uVar4 + 8;
      if (0x20 < uVar4) goto LAB_00235c62;
      ppvVar7 = (void **)((long)local_e8 + uVar8 + 8);
      uVar4 = uVar4 + 0x10;
    }
    else {
      plVar9 = (long *)*local_100;
      local_100 = local_100 + 1;
      uVar1 = uVar4;
LAB_00235c62:
      ppvVar7 = local_100;
      local_100 = local_100 + 1;
      uVar4 = uVar1;
    }
    if (*plVar9 != 0) {
      uVar1 = **ppvVar7;
      pCVar2 = S_bignum_cache->reg_;
      pCVar2[uVar1].nxt_ = S_bignum_cache->free_reg_;
      pCVar5->free_reg_ = pCVar2 + uVar1;
    }
    cnt = cnt - 1;
    if (cnt == 0) {
      err_throw(0xa28);
    }
  } while( true );
}

Assistant:

void CVmObjBigNum::alloc_temp_regs(size_t prec, size_t cnt, ...)
{
    va_list marker;
    size_t i;
    int failed;
    char **ext_ptr;
    uint *hdl_ptr;

    /* set up to read varargs */
    va_start(marker, cnt);

    /* no failures yet */
    failed = FALSE;

    /* scan the varargs list */
    for (i = 0 ; i < cnt ; ++i)
    {
        /* get the next argument */
        ext_ptr = va_arg(marker, char **);
        hdl_ptr = va_arg(marker, uint *);

        /* allocate a register */
        *ext_ptr = alloc_temp_reg(prec, hdl_ptr);

        /* if this allocation failed, note it, but keep going for now */
        if (*ext_ptr == 0)
            failed = TRUE;
    }

    /* done reading argument */
    va_end(marker);

    /* if we had any failures, free all of the registers we allocated */
    if (failed)
    {
        /* restart reading the varargs */
        va_start(marker, cnt);

        /* scan the varargs and free the successfully allocated registers */
        for (i = 0 ; i < cnt ; ++i)
        {
            /* get the next argument */
            ext_ptr = va_arg(marker, char **);
            hdl_ptr = va_arg(marker, uint *);

            /* free this register if we successfully allocated it */
            if (*ext_ptr != 0)
                release_temp_reg(*hdl_ptr);
        }

        /* done reading varargs */
        va_end(marker);

        /* throw the error */
        err_throw(VMERR_BIGNUM_NO_REGS);
    }
}